

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QTimeZone __thiscall QDateTime::Data::timeZone(Data *this)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong *in_RSI;
  long lVar4;
  
  uVar1 = *in_RSI;
  if ((uVar1 & 1) == 0) {
    switch(*(uint *)(uVar1 + 4) >> 4 & 3) {
    case 1:
switchD_00347f50_caseD_1:
      *(undefined8 *)this = 2;
      return (QTimeZone)(Data)this;
    case 2:
switchD_00347f50_caseD_2:
      lVar3 = (long)*(int *)(uVar1 + 0x10);
      lVar4 = 0;
      if (lVar3 + 0xe100U < 0x1c201) {
        lVar4 = (3 - (ulong)(lVar3 == 0)) + lVar3 * 4;
      }
      *(long *)this = lVar4;
      return (QTimeZone)(Data)this;
    case 3:
switchD_00347f50_caseD_3:
      bVar2 = QTimeZone::isValid((QTimeZone *)(uVar1 + 0x18));
      if (bVar2) {
        QTimeZone::QTimeZone((QTimeZone *)this,(QTimeZone *)(*in_RSI + 0x18));
        return (QTimeZone)(Data)this;
      }
      QTimeZone::QTimeZone((QTimeZone *)this);
      return (QTimeZone)(Data)this;
    }
  }
  else {
    switch((uint)(uVar1 >> 4) & 3) {
    case 1:
      goto switchD_00347f50_caseD_1;
    case 2:
      goto switchD_00347f50_caseD_2;
    case 3:
      goto switchD_00347f50_caseD_3;
    }
  }
  *(undefined8 *)this = 1;
  return (QTimeZone)(Data)this;
}

Assistant:

QTimeZone QDateTime::Data::timeZone() const
{
    switch (getSpec(*this)) {
    case Qt::UTC:
        return QTimeZone::UTC;
    case Qt::OffsetFromUTC:
        return QTimeZone::fromSecondsAheadOfUtc(d->m_offsetFromUtc);
    case Qt::TimeZone:
#if QT_CONFIG(timezone)
        if (d->m_timeZone.isValid())
            return d->m_timeZone;
#endif
        break;
    case Qt::LocalTime:
        return QTimeZone::LocalTime;
    }
    return QTimeZone();
}